

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O3

bool __thiscall
Js::ScriptContext::LeaveScriptStart<true,true>(ScriptContext *this,void *frameAddress)

{
  bool bVar1;
  ThreadContext *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  this_00 = this->threadContext;
  bVar1 = this_00->isScriptActive;
  if (bVar1 == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xa95,"(0)","Leaving ScriptStart while script is not active.");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  else {
    ThreadContext::ProbeStack(this_00,0x18000,this,(PVOID)0x0);
    ThreadContext::LeaveScriptStart<true>(this_00,frameAddress);
  }
  return bVar1;
}

Assistant:

bool ScriptContext::LeaveScriptStart(void * frameAddress)
    {
        ThreadContext * threadContext = this->threadContext;
        if (!threadContext->IsScriptActive())
        {
            // we should have enter always.
            AssertMsg(FALSE, "Leaving ScriptStart while script is not active.");
            return false;
        }

        // Make sure the host function will have at least 32k of stack available.
        if (stackProbe)
        {
            threadContext->ProbeStack(Js::Constants::MinStackCallout, this);
        }
        else
        {
            AssertMsg(ExceptionCheck::HasStackProbe(), "missing stack probe");
        }

        threadContext->LeaveScriptStart<leaveForHost>(frameAddress);
        return true;
    }